

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::web_peer_connection::~web_peer_connection(web_peer_connection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  (this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
  _vptr_bandwidth_socket = (_func_int **)&PTR_assign_bandwidth_004f81d0;
  (this->super_web_connection_base).super_peer_connection.super_disk_observer._vptr_disk_observer =
       (_func_int **)&DAT_004f8398;
  (this->super_web_connection_base).super_peer_connection.super_peer_connection_interface.
  _vptr_peer_connection_interface = (_func_int **)&PTR_destination_abi_cxx11__004f83b0;
  pcVar2 = (this->m_piece).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->m_piece).super_vector<char,_std::allocator<char>_>.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  pcVar3 = (this->m_url)._M_dataplus._M_p;
  paVar1 = &(this->m_url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ::std::
  _Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
  ::~_Deque_base(&(this->m_file_requests).
                  super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                );
  web_connection_base::~web_connection_base(&this->super_web_connection_base);
  operator_delete(this,0xb60);
  return;
}

Assistant:

class TORRENT_EXTRA_EXPORT web_peer_connection
		: public web_connection_base
	{
	friend struct invariant_access;
	public:

		// this is the constructor where the we are the active part.
		// The peer_connection should handshake and verify that the
		// other end has the correct id
		web_peer_connection(peer_connection_args& pack
			, aux::web_seed_t& web);

		void on_connected() override;

		connection_type type() const override
		{ return connection_type::url_seed; }

		// called from the main loop when this connection has any
		// work to do.
		void on_receive(error_code const& error
			, std::size_t bytes_transferred) override;

		std::string const& url() const override { return m_url; }

		void get_specific_peer_info(peer_info& p) const override;
		void disconnect(error_code const& ec
			, operation_t op, disconnect_severity_t error = peer_connection_interface::normal) override;

		void write_request(peer_request const& r) override;

		bool received_invalid_data(piece_index_t index, bool single_peer) override;

	private:

		void on_receive_padfile();
		void incoming_payload(char const* buf, int len);
		void incoming_zeroes(int len);
		void handle_redirect(int bytes_left);
		void handle_error(int bytes_left);
		void maybe_harvest_piece();
		void disable(error_code const& ec);

		// returns the block currently being
		// downloaded. And the progress of that
		// block. If the peer isn't downloading
		// a piece for the moment, the boost::optional
		// will be invalid.
		piece_block_progress downloading_piece_progress() const override;

		void handle_padfile();

		// this has one entry per http-request
		// (might be more than the bt requests)
		struct file_request_t
		{
			file_index_t file_index;
			int length;
			std::int64_t start;
		};
		std::deque<file_request_t> m_file_requests;

		std::string m_url;

		aux::web_seed_t* m_web;

		// this is used for intermediate storage of pieces to be delivered to the
		// bittorrent engine
		// TODO: 3 if we make this be a disk_buffer_holder instead
		// we would save a copy
		// use allocate_disk_receive_buffer and release_disk_receive_buffer
		aux::vector<char> m_piece;

		// the number of bytes we've forwarded to the incoming_payload() function
		// in the current HTTP response. used to know where in the buffer the
		// next response starts
		int m_received_body;

		// this is the offset inside the current receive
		// buffer where the next chunk header will be.
		// this is updated for each chunk header that's
		// parsed. It does not necessarily point to a valid
		// offset in the receive buffer, if we haven't received
		// it yet. This offset never includes the HTTP header
		int m_chunk_pos;

		// this is the number of bytes we've already received
		// from the next chunk header we're waiting for
		int m_partial_chunk_header;

		// the number of responses we've received so far on
		// this connection
		int m_num_responses;
	}